

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VWSqrSumMaskLocal(N_Vector X,N_Vector W,N_Vector ID,sunindextype param_4,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double __x;
  sunrealtype val;
  double dVar5;
  double dVar6;
  timespec spec;
  sunrealtype local_60;
  timespec local_40;
  
  __x = (double)myid;
  if (myid < 1) {
    val = 0.0;
  }
  else if (__x < 0.0) {
    val = sqrt(__x);
  }
  else {
    val = SQRT(__x);
  }
  lVar2 = param_4 + -1;
  if (param_4 < 2) {
    local_60 = INFINITY;
  }
  else {
    local_60 = 1.0 / SQRT((double)lVar2);
  }
  set_element_range(X,0,lVar2,val);
  set_element_range(W,0,lVar2,local_60);
  N_VConst(0x3ff0000000000000,ID);
  set_element(ID,lVar2,0.0);
  iVar4 = 1;
  clock_gettime(1,&local_40);
  lVar2 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  dVar5 = (double)N_VWSqrSumMaskLocal(X,W,ID);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  if (0.0 <= dVar5) {
    iVar1 = SUNRCompareTol(dVar5,__x,0x3e50000000000000);
    if (iVar1 == 0) {
      iVar4 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VWSqrSumMaskLocal");
      }
      goto LAB_0010f26e;
    }
  }
  printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n",(ulong)(uint)myid);
LAB_0010f26e:
  max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar6 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VWSqrSumMaskLocal");
  }
  return iVar4;
}

Assistant:

int Test_N_VWSqrSumMaskLocal(N_Vector X, N_Vector W, N_Vector ID,
                             sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, xval, wval;

  /* fill vector data */
  xval = SUNRsqrt(myid);
  wval = ONE / SUNRsqrt(local_length - 1);
  set_element_range(X, 0, local_length - 1, xval);
  set_element_range(W, 0, local_length - 1, wval);

  /* use all elements except one */
  N_VConst(ONE, ID);
  set_element(ID, local_length - 1, ZERO);

  start_time = get_time();
  ans        = N_VWSqrSumMaskLocal(X, W, ID);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VWSqrSumMaskLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWSqrSumMaskLocal", maxt);

  return (fails);
}